

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaFree(xmlSchemaPtr schema)

{
  xmlGenericErrorFunc p_Var1;
  long *plVar2;
  _xmlSchemaAnnot *p_Var3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlSchemaAnnotPtr pxVar6;
  long lVar7;
  
  if (schema == (xmlSchemaPtr)0x0) {
    return;
  }
  if (schema->volatiles != (void *)0x0) {
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
              ,0x1059);
  }
  if (schema->notaDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->notaDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->attrDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->attrDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->attrgrpDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->attrgrpDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->elemDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->elemDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->typeDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->typeDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->groupDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->groupDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->idcDef != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->idcDef,(xmlHashDeallocator)0x0);
  }
  if (schema->schemasImports != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->schemasImports,xmlSchemaBucketFreeEntry);
  }
  plVar2 = (long *)schema->includes;
  if (plVar2 != (long *)0x0) {
    if (0 < (int)plVar2[1]) {
      lVar7 = 0;
      do {
        xmlSchemaBucketFree(*(xmlSchemaBucketPtr_conflict *)(*plVar2 + lVar7 * 8));
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)plVar2[1]);
    }
    if ((void *)*plVar2 != (void *)0x0) {
      (*xmlFree)((void *)*plVar2);
    }
    (*xmlFree)(plVar2);
  }
  pxVar6 = schema->annot;
  if (pxVar6 != (xmlSchemaAnnotPtr)0x0) {
    if (pxVar6->next == (_xmlSchemaAnnot *)0x0) {
      (*xmlFree)(pxVar6);
    }
    else {
      do {
        p_Var3 = pxVar6->next;
        (*xmlFree)(pxVar6);
        pxVar6 = p_Var3;
      } while (p_Var3 != (_xmlSchemaAnnot *)0x0);
    }
  }
  xmlDictFree(schema->dict);
  (*xmlFree)(schema);
  return;
}

Assistant:

void
xmlSchemaFree(xmlSchemaPtr schema)
{
    if (schema == NULL)
        return;
    /* @volatiles is not used anymore :-/ */
    if (schema->volatiles != NULL)
	TODO
    /*
    * Note that those slots are not responsible for freeing
    * schema components anymore; this will now be done by
    * the schema buckets.
    */
    if (schema->notaDecl != NULL)
        xmlHashFree(schema->notaDecl, NULL);
    if (schema->attrDecl != NULL)
        xmlHashFree(schema->attrDecl, NULL);
    if (schema->attrgrpDecl != NULL)
        xmlHashFree(schema->attrgrpDecl, NULL);
    if (schema->elemDecl != NULL)
        xmlHashFree(schema->elemDecl, NULL);
    if (schema->typeDecl != NULL)
        xmlHashFree(schema->typeDecl, NULL);
    if (schema->groupDecl != NULL)
        xmlHashFree(schema->groupDecl, NULL);
    if (schema->idcDef != NULL)
        xmlHashFree(schema->idcDef, NULL);

    if (schema->schemasImports != NULL)
	xmlHashFree(schema->schemasImports, xmlSchemaBucketFreeEntry);
    if (schema->includes != NULL) {
	xmlSchemaItemListPtr list = (xmlSchemaItemListPtr) schema->includes;
	int i;
	for (i = 0; i < list->nbItems; i++) {
	    xmlSchemaBucketFree((xmlSchemaBucketPtr) list->items[i]);
	}
	xmlSchemaItemListFree(list);
    }
    if (schema->annot != NULL)
        xmlSchemaFreeAnnot(schema->annot);
    /* Never free the doc here, since this will be done by the buckets. */

    xmlDictFree(schema->dict);
    xmlFree(schema);
}